

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oracle.cc
# Opt level: O0

void __thiscall parser::KOracle::load_oracle(KOracle *this,string *file,bool is_training)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  istream *piVar6;
  long lVar7;
  string *psVar8;
  size_type sVar9;
  void *pvVar10;
  compressed_ifstream *this_00;
  byte in_DL;
  string *in_RSI;
  char *pcVar11;
  long in_RDI;
  int termc;
  string word;
  istrstream istr;
  value_type *cur_sent;
  vector<int,_std::allocator<int>_> cur_acts;
  string line;
  int lc;
  int kTERM_INT;
  int kSHIFT_INT;
  int kREDUCE_INT;
  string kTERM;
  string kSHIFT;
  string kREDUCE;
  compressed_ifstream in;
  value_type_conflict2 *in_stack_fffffffffffff7a8;
  vector<parser::Sentence,_std::allocator<parser::Sentence>_> *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  undefined4 in_stack_fffffffffffff7bc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  string *in_stack_fffffffffffff810;
  Dict *in_stack_fffffffffffff818;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff820;
  Dict *in_stack_fffffffffffff828;
  string *in_stack_fffffffffffff830;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff848;
  undefined4 in_stack_fffffffffffff850;
  int in_stack_fffffffffffff854;
  string *in_stack_fffffffffffff8c8;
  compressed_ifstream *in_stack_fffffffffffff8d0;
  allocator *paVar12;
  string local_6b8 [36];
  int local_694;
  string local_690 [32];
  istream local_670;
  reference local_500;
  string local_4e0 [32];
  int local_4c0;
  allocator local_4b9;
  string local_4b8 [32];
  int local_498;
  allocator local_491;
  string local_490 [32];
  int local_470;
  allocator local_469;
  string local_468 [32];
  int local_448;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [55];
  allocator local_3b9;
  string local_3b8 [32];
  istream local_398 [3];
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  poVar5 = std::operator<<((ostream *)&std::cerr,"Loading top-down oracle from ");
  poVar5 = std::operator<<(poVar5,local_10);
  poVar5 = std::operator<<(poVar5," [");
  pcVar11 = "non-training";
  if ((local_11 & 1) != 0) {
    pcVar11 = "training";
  }
  poVar5 = std::operator<<(poVar5,pcVar11);
  std::operator<<(poVar5,"] ...\n");
  pcVar11 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,pcVar11,&local_3b9);
  cnn::compressed_ifstream::compressed_ifstream(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8)
  ;
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(local_398[0]._vptr_basic_istream[-3] +
                            (long)&local_398[0]._vptr_basic_istream));
  if (!bVar1) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/oracle.cc"
                  ,0x2e,"void parser::KOracle::load_oracle(const string &, bool)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"REDUCE",&local_3f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"SHIFT",&local_419);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"TERM",&local_441);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"REDUCE",&local_469);
  iVar3 = cnn::Dict::Convert(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  local_448 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"SHIFT",&local_491);
  iVar3 = cnn::Dict::Convert(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  paVar12 = &local_4b9;
  local_470 = iVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"TERM",paVar12);
  iVar3 = cnn::Dict::Convert(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  local_4c0 = 0;
  local_498 = iVar3;
  std::__cxx11::string::string(local_4e0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x494da2);
  do {
    do {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&piVar6->_vptr_basic_istream +
                                (long)piVar6->_vptr_basic_istream[-3]));
      if (!bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Loaded ");
        sVar9 = std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::size
                          ((vector<parser::Sentence,_std::allocator<parser::Sentence>_> *)
                           (in_RDI + 0x40));
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar9);
        std::operator<<(poVar5," sentences\n");
        poVar5 = std::operator<<((ostream *)&std::cerr,"    cumulative      action vocab size: ");
        uVar4 = cnn::Dict::size((Dict *)0x49576c);
        pvVar10 = (void *)std::ostream::operator<<(poVar5,uVar4);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cerr,"    cumulative    terminal vocab size: ");
        uVar4 = cnn::Dict::size((Dict *)0x4957c5);
        pvVar10 = (void *)std::ostream::operator<<(poVar5,uVar4);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cerr,"    cumulative nonterminal vocab size: ");
        uVar4 = cnn::Dict::size((Dict *)0x49581e);
        pvVar10 = (void *)std::ostream::operator<<(poVar5,uVar4);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)&std::cerr,"    cumulative         pos vocab size: ");
        uVar4 = cnn::Dict::size((Dict *)0x495877);
        this_00 = (compressed_ifstream *)std::ostream::operator<<(poVar5,uVar4);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar5)
        ;
        std::__cxx11::string::~string(local_4e0);
        std::__cxx11::string::~string(local_440);
        std::__cxx11::string::~string(local_418);
        std::__cxx11::string::~string(local_3f0);
        cnn::compressed_ifstream::~compressed_ifstream(this_00);
        return;
      }
      local_4c0 = local_4c0 + 1;
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x494e0f);
      lVar7 = std::__cxx11::string::size();
    } while ((lVar7 == 0) ||
            ((pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_4e0), *pcVar11 == '#'
             && (pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_4e0),
                *pcVar11 == '('))));
    std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::size
              ((vector<parser::Sentence,_std::allocator<parser::Sentence>_> *)(in_RDI + 0x40));
    std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::resize
              ((vector<parser::Sentence,_std::allocator<parser::Sentence>_> *)
               CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (size_type)in_stack_fffffffffffff7c8);
    local_500 = std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::back
                          (in_stack_fffffffffffff7b0);
    if ((local_11 & 1) == 0) {
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      std::istrstream::istrstream((istrstream *)&local_670,pcVar11);
      std::__cxx11::string::string(local_690);
      while( true ) {
        piVar6 = std::operator>>(&local_670,local_690);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&piVar6->_vptr_basic_istream +
                                  (long)piVar6->_vptr_basic_istream[-3]));
        if (!bVar1) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff7c0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 in_stack_fffffffffffff848);
      std::__cxx11::string::~string(local_690);
      std::istrstream::~istrstream((istrstream *)&local_670);
    }
    else {
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      Oracle::ReadSentenceView
                (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    }
    local_4c0 = local_4c0 + 3;
    bVar1 = Sentence::SizesMatch
                      ((Sentence *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    if (!bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Mismatched lengths of input strings in oracle before line ");
      pvVar10 = (void *)std::ostream::operator<<(poVar5,local_4c0);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_694 = 0;
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_398,local_4e0);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&piVar6->_vptr_basic_istream +
                                (long)piVar6->_vptr_basic_istream[-3]));
      if (!bVar1) break;
      local_4c0 = local_4c0 + 1;
      lVar7 = std::__cxx11::string::size();
      if (lVar7 == 0) break;
      lVar7 = std::__cxx11::string::find((char)local_4e0,0x20);
      if (lVar7 != -1) {
        __assert_fail("line.find(\' \') == string::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/oracle.cc"
                      ,0x5d,"void parser::KOracle::load_oracle(const string &, bool)");
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                              in_stack_fffffffffffff7c8);
      if (_Var2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c0,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)local_4e0,0x664b84);
        if (lVar7 == 0) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_6b8,(ulong)local_4e0);
          cnn::Dict::Convert(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
          std::__cxx11::string::~string(local_6b8);
          in_stack_fffffffffffff854 =
               cnn::Dict::Convert(in_stack_fffffffffffff818,in_stack_fffffffffffff810);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7b0,
                     in_stack_fffffffffffff7a8);
        }
        else {
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                                  in_stack_fffffffffffff7c8);
          if (_Var2) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c0,
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
            local_694 = local_694 + 1;
          }
          else {
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                                    ,in_stack_fffffffffffff7c8);
            if (!_Var2) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Malformed input in line ");
              pvVar10 = (void *)std::ostream::operator<<(poVar5,local_4c0);
              std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
              abort();
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c0,
                       (value_type_conflict2 *)
                       CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
          }
        }
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(in_stack_fffffffffffff7c0,
                (value_type *)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
    in_stack_fffffffffffff830 = (string *)(long)local_694;
    std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::back
              (in_stack_fffffffffffff7b0);
    psVar8 = (string *)Sentence::size((Sentence *)0x49567b);
    if (in_stack_fffffffffffff830 != psVar8) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "Mismatched number of tokens and SHIFTs in oracle before line ");
      pvVar10 = (void *)std::ostream::operator<<(poVar5,local_4c0);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      abort();
    }
  } while( true );
}

Assistant:

void KOracle::load_oracle(const string& file, bool is_training) {
  cerr << "Loading top-down oracle from " << file << " [" << (is_training ? "training" : "non-training") << "] ...\n";
  cnn::compressed_ifstream in(file.c_str());
  assert(in);
  const string kREDUCE = "REDUCE";
  const string kSHIFT = "SHIFT";
  const string kTERM = "TERM";
  const int kREDUCE_INT = ad->Convert("REDUCE");
  const int kSHIFT_INT = ad->Convert("SHIFT");
  const int kTERM_INT = ad->Convert("TERM");
  int lc = 0;
  string line;
  vector<int> cur_acts;
  while(getline(in, line)) {
    ++lc;
    //cerr << "line number = " << lc << endl;
    cur_acts.clear();
    if (line.size() == 0 || (line[0] == '#' && line[2] == '(')) continue;
    sents.resize(sents.size() + 1);
    auto& cur_sent = sents.back();
    if (is_training) {  // at training time, we load both "UNKified" versions of the data, and raw versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.raw);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
    } else { // at test time, we ignore the raw strings and just use the "UNKified" versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      istrstream istr(line.c_str());
      string word;
      while(istr>>word) cur_sent.surfaces.push_back(word);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
      cur_sent.raw = cur_sent.unk;
    }
    lc += 3;
    if (!cur_sent.SizesMatch()) {
      cerr << "Mismatched lengths of input strings in oracle before line " << lc << endl;
      abort();
    }
    int termc = 0;
    while(getline(in, line)) {
      ++lc;
      //cerr << "line number = " << lc << endl;
      if (line.size() == 0) break;
      assert(line.find(' ') == string::npos);
      if (line == kREDUCE) {
        cur_acts.push_back(kREDUCE_INT);
      } else if (line.find("PJ(") == 0) {
        // Convert NT
        nd->Convert(line.substr(3, line.size() - 4));
        // PJ(X) is put into the actions list as PJ(X)
        cur_acts.push_back(ad->Convert(line));
      } else if (line == kSHIFT) {
        cur_acts.push_back(kSHIFT_INT);
        termc++;
      } else if (line == kTERM){
	cur_acts.push_back(kTERM_INT);
      } else {
        cerr << "Malformed input in line " << lc << endl;
        abort();
      }
    }
    actions.push_back(cur_acts);
    if (termc != sents.back().size()) {
      cerr << "Mismatched number of tokens and SHIFTs in oracle before line " << lc << endl;
      abort();
    }
  }
  cerr << "Loaded " << sents.size() << " sentences\n";
  cerr << "    cumulative      action vocab size: " << ad->size() << endl;
  cerr << "    cumulative    terminal vocab size: " << d->size() << endl;
  cerr << "    cumulative nonterminal vocab size: " << nd->size() << endl;
  cerr << "    cumulative         pos vocab size: " << pd->size() << endl;
}